

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O1

int CfdDecryptAES(void *handle,char *key,char *cbc_iv,char *buffer,char **output)

{
  pointer pcVar1;
  size_t sVar2;
  char *pcVar3;
  CfdException *pCVar4;
  ByteData iv;
  ByteData aes_data;
  ByteData data;
  ByteData key_data;
  undefined1 local_b0 [32];
  ByteData local_90;
  ByteData local_78;
  ByteData local_60;
  ByteData local_48;
  
  cfd::Initialize();
  if (key == (char *)0x0) {
    local_b0._0_8_ = "cfdcapi_common.cpp";
    local_b0._8_4_ = 0x301;
    local_b0._16_8_ = "CfdDecryptAES";
    cfd::core::logger::log<>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,"key is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"Failed to parameter. key is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_b0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (buffer == (char *)0x0) {
    local_b0._0_8_ = "cfdcapi_common.cpp";
    local_b0._8_4_ = 0x307;
    local_b0._16_8_ = "CfdDecryptAES";
    cfd::core::logger::log<>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,"buffer is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"Failed to parameter. buffer is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_b0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (output == (char **)0x0) {
    local_b0._0_8_ = "cfdcapi_common.cpp";
    local_b0._8_4_ = 0x30d;
    local_b0._16_8_ = "CfdDecryptAES";
    cfd::core::logger::log<>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,"output is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"Failed to parameter. output is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_b0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pcVar1 = local_b0 + 0x10;
  local_b0._0_8_ = pcVar1;
  sVar2 = strlen(key);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,key,key + sVar2);
  cfd::core::ByteData::ByteData(&local_48,(string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_);
  }
  local_b0._0_8_ = pcVar1;
  sVar2 = strlen(buffer);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,buffer,buffer + sVar2);
  cfd::core::ByteData::ByteData(&local_60,(string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_);
  }
  if ((cbc_iv == (char *)0x0) || (*cbc_iv == '\0')) {
    cfd::core::CryptoUtil::DecryptAes256(&local_90,&local_48,&local_60);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_b0,&local_90);
    pcVar3 = cfd::capi::CreateString((string *)local_b0);
    *output = pcVar3;
    local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b0._0_8_;
    if ((pointer)local_b0._0_8_ == pcVar1) goto LAB_003dfd55;
  }
  else {
    std::__cxx11::string::string((string *)local_b0,cbc_iv,(allocator *)&local_78);
    cfd::core::ByteData::ByteData(&local_90,(string *)local_b0);
    if ((pointer)local_b0._0_8_ != pcVar1) {
      operator_delete((void *)local_b0._0_8_);
    }
    cfd::core::CryptoUtil::DecryptAes256Cbc(&local_78,&local_48,&local_90,&local_60);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_b0,&local_78);
    pcVar3 = cfd::capi::CreateString((string *)local_b0);
    *output = pcVar3;
    if ((pointer)local_b0._0_8_ != pcVar1) {
      operator_delete((void *)local_b0._0_8_);
    }
    if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_003dfd55;
  }
  operator_delete(local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start);
LAB_003dfd55:
  if (local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdDecryptAES(
    void* handle, const char* key, const char* cbc_iv, const char* buffer,
    char** output) {
  try {
    cfd::Initialize();
    if (key == nullptr) {
      warn(CFD_LOG_SOURCE, "key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null.");
    }
    if (buffer == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. buffer is null.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    ByteData key_data(key);
    ByteData data(buffer);

    if (cfd::capi::IsEmptyString(cbc_iv)) {
      auto aes_data = cfd::core::CryptoUtil::DecryptAes256(key_data, data);
      *output = cfd::capi::CreateString(aes_data.GetHex());
    } else {
      ByteData iv(cbc_iv);
      auto aes_data =
          cfd::core::CryptoUtil::DecryptAes256Cbc(key_data, iv, data);
      *output = cfd::capi::CreateString(aes_data.GetHex());
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}